

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

int __thiscall imrt::Collimator::searchReferenceIndex(Collimator *this,pair<int,_int> p)

{
  mapped_type *pmVar1;
  key_type_conflict local_34;
  
  local_34 = 0;
  if (0 < this->ref_size) {
    do {
      pmVar1 = std::
               map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               ::operator[](&this->reference,&local_34);
      if ((pmVar1->first == p.first) &&
         (pmVar1 = std::
                   map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                   ::operator[](&this->reference,&local_34), pmVar1->second == p.second)) {
        return local_34;
      }
      local_34 = local_34 + 1;
    } while (local_34 < this->ref_size);
  }
  return -1;
}

Assistant:

int Collimator::searchReferenceIndex (pair<int, int> p) {
    for (int i=0;i<ref_size;i++) {
      if (reference[i].first == p.first && reference[i].second==p.second)
        return(i);
    }
    return(-1);
  }